

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void rhash_md5_final(md5_ctx *ctx,uchar *result)

{
  uint uVar1;
  sbyte sVar2;
  uint local_1c;
  uint shift;
  uint index;
  uchar *result_local;
  md5_ctx *ctx_local;
  
  uVar1 = ((uint)ctx->length & 0x3f) >> 2;
  sVar2 = (sbyte)(((uint)ctx->length & 3) << 3);
  ctx->message[uVar1] = (-1 << sVar2 ^ 0xffffffffU) & ctx->message[uVar1];
  local_1c = uVar1 + 1;
  ctx->message[uVar1] = 0x80 << sVar2 ^ ctx->message[uVar1];
  if (0xe < local_1c) {
    while (local_1c < 0x10) {
      ctx->message[local_1c] = 0;
      local_1c = local_1c + 1;
    }
    rhash_md5_process_block(ctx->hash,ctx->message);
    local_1c = 0;
  }
  while (local_1c < 0xe) {
    ctx->message[local_1c] = 0;
    local_1c = local_1c + 1;
  }
  ctx->message[0xe] = (uint)(ctx->length << 3);
  ctx->message[0xf] = (uint)(ctx->length >> 0x1d);
  rhash_md5_process_block(ctx->hash,ctx->message);
  if (result != (uchar *)0x0) {
    *(undefined8 *)result = *(undefined8 *)ctx->hash;
    *(undefined8 *)(result + 8) = *(undefined8 *)(ctx->hash + 2);
  }
  return;
}

Assistant:

void rhash_md5_final(md5_ctx *ctx, unsigned char* result)
{
	unsigned index = ((unsigned)ctx->length & 63) >> 2;
	unsigned shift = ((unsigned)ctx->length & 3) * 8;

	/* pad message and run for last block */

	/* append the byte 0x80 to the message */
	ctx->message[index]   &= ~(0xFFFFFFFFu << shift);
	ctx->message[index++] ^= 0x80u << shift;

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			ctx->message[index++] = 0;
		}
		rhash_md5_process_block(ctx->hash, ctx->message);
		index = 0;
	}
	while (index < 14) {
		ctx->message[index++] = 0;
	}
	ctx->message[14] = (unsigned)(ctx->length << 3);
	ctx->message[15] = (unsigned)(ctx->length >> 29);
	rhash_md5_process_block(ctx->hash, ctx->message);

	if (result) le32_copy(result, 0, &ctx->hash, 16);
}